

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp-mpiu.c
# Opt level: O3

int MPIU_Alltoallv(void *sendbuf,int *sendcnts,int *sdispls,MPI_Datatype sendtype,void *recvbuf,
                  int *recvcnts,int *rdispls,MPI_Datatype recvtype,MPI_Comm comm,
                  MPIU_AlltoallvSparsePolicy policy)

{
  int *__ptr;
  int iVar1;
  long lVar2;
  int *__ptr_00;
  void *__ptr_01;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  int iVar7;
  int *__ptr_02;
  int ThisTask_1;
  ptrdiff_t recv_elsize;
  ptrdiff_t send_elsize;
  int ThisTask;
  ptrdiff_t lb;
  int local_a0;
  int local_9c;
  int local_98;
  uint local_94;
  int *local_90;
  int *local_88;
  MPI_Datatype local_80;
  void *local_78;
  int *local_70;
  void *local_68;
  int *local_60;
  int *local_58;
  long local_50;
  long local_48;
  undefined1 local_3c [4];
  undefined1 local_38 [8];
  
  local_80 = sendtype;
  local_78 = recvbuf;
  local_68 = sendbuf;
  MPI_Comm_rank(comm,local_3c);
  MPI_Comm_size(comm,&local_9c);
  lVar6 = (long)local_9c;
  if (lVar6 < 1) {
    uVar3 = 0;
  }
  else {
    lVar2 = 0;
    uVar3 = 0;
    do {
      uVar3 = uVar3 + (0 < sendcnts[lVar2]);
      lVar2 = lVar2 + 1;
    } while (lVar6 != lVar2);
    uVar3 = (uint)(0x80 < uVar3);
  }
  if (recvcnts == (int *)0x0) {
    __ptr_00 = (int *)malloc(lVar6 << 2);
    MPI_Alltoall(sendcnts,1,&ompi_mpi_int,__ptr_00,1,&ompi_mpi_int,comm);
    recvcnts = __ptr_00;
  }
  else {
    __ptr_00 = (int *)0x0;
  }
  if (local_78 == (void *)0x0) {
    if ((long)local_9c < 1) {
      iVar1 = 0;
    }
    else {
      lVar6 = 0;
      iVar1 = 0;
      do {
        iVar1 = iVar1 + recvcnts[lVar6];
        lVar6 = lVar6 + 1;
      } while (local_9c != lVar6);
    }
    goto LAB_00105816;
  }
  local_90 = (int *)CONCAT44(local_90._4_4_,uVar3);
  if (sdispls == (int *)0x0) {
    lVar6 = (long)local_9c;
    sdispls = (int *)malloc(lVar6 * 4);
    *sdispls = 0;
    local_88 = sdispls;
    if (1 < lVar6) {
      lVar2 = 1;
      iVar1 = 0;
      do {
        iVar1 = iVar1 + sendcnts[lVar2 + -1];
        sdispls[lVar2] = iVar1;
        lVar2 = lVar2 + 1;
      } while (lVar6 != lVar2);
    }
  }
  else {
    local_88 = (int *)0x0;
  }
  local_70 = sdispls;
  if (rdispls == (int *)0x0) {
    lVar6 = (long)local_9c;
    rdispls = (int *)malloc(lVar6 * 4);
    *rdispls = 0;
    __ptr_02 = rdispls;
    if (1 < lVar6) {
      lVar2 = 1;
      iVar1 = 0;
      do {
        iVar1 = iVar1 + recvcnts[lVar2 + -1];
        rdispls[lVar2] = iVar1;
        lVar2 = lVar2 + 1;
      } while (lVar6 != lVar2);
    }
  }
  else {
    __ptr_02 = (int *)0x0;
  }
  if (policy == AUTO) {
    local_a0 = (int)local_90;
    MPI_Allreduce(1,&local_a0,1,&ompi_mpi_int,&ompi_mpi_op_sum,comm);
    if (local_a0 == 0) goto LAB_0010564a;
LAB_0010560d:
    iVar1 = MPI_Alltoallv(local_68,sendcnts,local_70,local_80,local_78,recvcnts,rdispls,recvtype,
                          comm);
  }
  else {
    if (policy == REQUIRED) {
      local_a0 = 0;
    }
    else if (policy == DISABLED) {
      local_a0 = 1;
      goto LAB_0010560d;
    }
LAB_0010564a:
    local_60 = __ptr_02;
    local_58 = rdispls;
    MPI_Comm_rank(comm,&local_94);
    MPI_Comm_size(comm,&local_98);
    iVar1 = 0;
    do {
      uVar3 = 1 << ((byte)iVar1 & 0x1f);
      iVar1 = iVar1 + 1;
    } while ((int)uVar3 < local_98);
    local_90 = __ptr_00;
    MPI_Type_get_extent(local_80,local_38,&local_48);
    MPI_Type_get_extent(recvtype,local_38,&local_50);
    __ptr_01 = malloc((long)local_98 << 4);
    if (iVar1 == 0x20) {
      MPI_Barrier(comm);
      iVar7 = 0;
    }
    else {
      uVar5 = 1;
      if (1 < (int)uVar3) {
        uVar5 = uVar3;
      }
      uVar3 = 0;
      iVar7 = 0;
      do {
        uVar4 = local_94 ^ uVar3;
        if ((int)uVar4 < local_98) {
          if (recvcnts[(int)uVar4] != 0) {
            lVar6 = (long)iVar7;
            iVar7 = iVar7 + 1;
            MPI_Irecv((void *)(local_58[(int)uVar4] * local_50 + (long)local_78),
                      recvcnts[(int)uVar4],recvtype,uVar4,0x18e2e,comm,
                      (void *)((long)__ptr_01 + lVar6 * 8));
          }
        }
        uVar3 = uVar3 + 1;
      } while (uVar5 != uVar3);
      MPI_Barrier(comm);
      uVar3 = 0;
      do {
        uVar4 = local_94 ^ uVar3;
        if ((int)uVar4 < local_98) {
          if (sendcnts[(int)uVar4] != 0) {
            lVar6 = (long)iVar7;
            iVar7 = iVar7 + 1;
            MPI_Isend((void *)(local_70[(int)uVar4] * local_48 + (long)local_68),
                      sendcnts[(int)uVar4],local_80,uVar4,0x18e2e,comm,
                      (void *)((long)__ptr_01 + lVar6 * 8));
          }
        }
        uVar3 = uVar3 + 1;
      } while (uVar5 != uVar3);
    }
    iVar1 = 0;
    MPI_Waitall(iVar7,__ptr_01,0);
    free(__ptr_01);
    MPI_Barrier(comm);
    __ptr_00 = local_90;
    __ptr_02 = local_60;
  }
  __ptr = local_88;
  if (__ptr_02 != (int *)0x0) {
    free(__ptr_02);
  }
  if (__ptr != (int *)0x0) {
    free(__ptr);
  }
LAB_00105816:
  if (__ptr_00 != (int *)0x0) {
    free(__ptr_00);
  }
  return iVar1;
}

Assistant:

int MPIU_Alltoallv(void *sendbuf, int *sendcnts, int *sdispls,
        MPI_Datatype sendtype, void *recvbuf, int *recvcnts,
        int *rdispls, MPI_Datatype recvtype, MPI_Comm comm,
        enum MPIU_AlltoallvSparsePolicy policy
)
/*
 * sdispls, recvcnts rdispls can be NULL,
 *
 * if recvbuf is NULL, returns total number of item required to hold the
 * data.
 * */
{
    int ThisTask;
    int NTask;
    MPI_Comm_rank(comm, &ThisTask);
    MPI_Comm_size(comm, &NTask);
    int i;
    int nn = 0;
    int *a_sdispls=NULL, *a_recvcnts=NULL, *a_rdispls=NULL;
    for(i = 0; i < NTask; i ++) {
        if(sendcnts[i] > 0) {
            nn ++;
        }
    }
    if(recvcnts == NULL) {
        a_recvcnts = malloc(sizeof(int) * NTask);
        recvcnts = a_recvcnts;
        MPI_Alltoall(sendcnts, 1, MPI_INT,
                     recvcnts, 1, MPI_INT, comm);
    }
    if(recvbuf == NULL) {
        int totalrecv = 0;
        for(i = 0; i < NTask; i ++) {
            totalrecv += recvcnts[i];
        }
        if(a_recvcnts)
            free(a_recvcnts);
        return totalrecv;
    }
    if(sdispls == NULL) {
        a_sdispls = malloc(sizeof(int) * NTask);
        sdispls = a_sdispls;
        sdispls[0] = 0;
        for (i = 1; i < NTask; i++) {
            sdispls[i] = sdispls[i - 1] + sendcnts[i - 1];
        }
    }
    if(rdispls == NULL) {
        a_rdispls = malloc(sizeof(int) * NTask);
        rdispls = a_rdispls;
        rdispls[0] = 0;
        for (i = 1; i < NTask; i++) {
            rdispls[i] = rdispls[i - 1] + recvcnts[i - 1];
        }
    }

    int dense;

    if(policy == AUTO) {
        dense = nn > 128;
        MPI_Allreduce(MPI_IN_PLACE, &dense, 1, MPI_INT, MPI_SUM, comm);
    }
    if(policy == DISABLED) {
        dense = 1;
    }
    if(policy == REQUIRED) {
        dense = 0;
    }

    int ret;
    if(dense != 0) {
        ret = MPI_Alltoallv(sendbuf, sendcnts, sdispls,
                    sendtype, recvbuf,
                    recvcnts, rdispls, recvtype, comm);
    } else {
        ret = MPI_Alltoallv_sparse(sendbuf, sendcnts, sdispls,
                    sendtype, recvbuf,
                    recvcnts, rdispls, recvtype, comm);
    }

    if(a_rdispls)
        free(a_rdispls);
    if(a_sdispls)
        free(a_sdispls);
    if(a_recvcnts)
        free(a_recvcnts);
    return ret;
}